

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O0

int __thiscall Fl_Menu_::remove(Fl_Menu_ *this,char *__filename)

{
  int iVar1;
  int iVar2;
  Fl_Menu_Item *this_00;
  Fl_Menu_Item *__src;
  void *pvVar3;
  int iVar4;
  Fl_Menu_Item *local_30;
  Fl_Menu_Item *m;
  Fl_Menu_Item *next_item;
  Fl_Menu_Item *item;
  int n;
  int i_local;
  Fl_Menu_ *this_local;
  
  iVar4 = (int)__filename;
  iVar1 = size(this);
  iVar2 = iVar1;
  if ((-1 < iVar4) && (iVar2 = iVar4, iVar4 < iVar1)) {
    if (this->alloc == '\0') {
      copy(this,(EVP_PKEY_CTX *)this->menu_,(EVP_PKEY_CTX *)0x0);
    }
    this_00 = this->menu_ + iVar4;
    __src = Fl_Menu_Item::next(this_00,1);
    local_30 = this_00;
    if (1 < this->alloc) {
      for (; local_30 < __src; local_30 = local_30 + 1) {
        if (local_30->text != (char *)0x0) {
          free(local_30->text);
        }
      }
    }
    pvVar3 = memmove(this_00,__src,
                     (((long)this->menu_ + ((long)iVar1 * 0x38 - (long)__src)) / 0x38) * 0x38);
    iVar2 = (int)pvVar3;
  }
  return iVar2;
}

Assistant:

void Fl_Menu_::remove(int i) {
  int n = size();
  if (i<0 || i>=n) return;
  if (!alloc) copy(menu_);
  // find the next item, skipping submenus:
  Fl_Menu_Item* item = menu_+i;
  const Fl_Menu_Item* next_item = item->next();
  // delete the text only if all items were created with add():
  if (alloc > 1) {
    for (Fl_Menu_Item* m = item; m < next_item; m++)
      if (m->text) free((void*)(m->text));
  }
  // MRS: "n" is the menu size(), which includes the trailing NULL entry...
  memmove(item, next_item, (menu_+n-next_item)*sizeof(Fl_Menu_Item));
}